

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::OverlapF0Candidates
               (int f0_length,int number_of_candidates,double **f0_candidates)

{
  int k_1;
  int k;
  int j;
  int i;
  int n;
  double **f0_candidates_local;
  int number_of_candidates_local;
  int f0_length_local;
  
  for (i = 1; i < 4; i = i + 1) {
    for (j = 0; j < number_of_candidates; j = j + 1) {
      for (k = i; k < f0_length; k = k + 1) {
        f0_candidates[k][j + number_of_candidates * i] = f0_candidates[k - i][j];
      }
      for (k_1 = 0; k_1 < f0_length - i; k_1 = k_1 + 1) {
        f0_candidates[k_1][j + number_of_candidates * (i + 3)] = f0_candidates[k_1 + i][j];
      }
    }
  }
  return;
}

Assistant:

static void OverlapF0Candidates(int f0_length, int number_of_candidates,
    double **f0_candidates) {
  int n = 3;
  for (int i = 1; i <= n; ++i)
    for (int j = 0; j < number_of_candidates; ++j) {
      for (int k = i; k < f0_length; ++k)
        f0_candidates[k][j + (number_of_candidates * i)] =
          f0_candidates[k - i][j];
      for (int k = 0; k < f0_length - i; ++k)
        f0_candidates[k][j + (number_of_candidates * (i + n))] =
          f0_candidates[k + i][j];
    }
}